

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::casesToStr(LineContinuationTest *this,CASES cases)

{
  char *local_20;
  GLchar *result;
  CASES cases_local;
  LineContinuationTest *this_local;
  
  switch(cases) {
  case ASSIGNMENT_BEFORE_OPERATOR:
    local_20 = "just before assignment operator";
    break;
  case ASSIGNMENT_AFTER_OPERATOR:
    local_20 = "just after assignment operator";
    break;
  case VECTOR_VARIABLE_INITIALIZER:
    local_20 = "inside vector variable initializer";
    break;
  case TOKEN_INSIDE_FUNCTION_NAME:
    local_20 = "inside function name";
    break;
  case TOKEN_INSIDE_TYPE_NAME:
    local_20 = "inside type name";
    break;
  case TOKEN_INSIDE_VARIABLE_NAME:
    local_20 = "inside variable name";
    break;
  case PREPROCESSOR_TOKEN_INSIDE:
    local_20 = "inside preprocessor token";
    break;
  case PREPROCESSOR_TOKEN_BETWEEN:
    local_20 = "between preprocessor token";
    break;
  case COMMENT:
    local_20 = "inside comment";
    break;
  case SOURCE_TERMINATION_NULL:
    local_20 = "just before null terminating source";
    break;
  case SOURCE_TERMINATION_NON_NULL:
    local_20 = "as last character in source string, without null termination";
    break;
  case PART_TERMINATION_NULL:
    local_20 = "just before null terminating part of source";
    break;
  case PART_NEXT_TO_TERMINATION_NULL:
    local_20 = "just before last character in part of source";
    break;
  case PART_TERMINATION_NON_NULL:
    local_20 = "as last character in part string, without null termination";
    break;
  case PART_NEXT_TO_TERMINATION_NON_NULL:
    local_20 = "just before last character in part string, without null termination";
    break;
  case DEBUG_CASE:
  default:
    local_20 = "nowhere at all. This is debug!";
  }
  return local_20;
}

Assistant:

const GLchar* LineContinuationTest::casesToStr(CASES cases) const
{
	const GLchar* result = 0;
	switch (cases)
	{
	case ASSIGNMENT_BEFORE_OPERATOR:
		result = "just before assignment operator";
		break;
	case ASSIGNMENT_AFTER_OPERATOR:
		result = "just after assignment operator";
		break;
	case VECTOR_VARIABLE_INITIALIZER:
		result = "inside vector variable initializer";
		break;
	case TOKEN_INSIDE_FUNCTION_NAME:
		result = "inside function name";
		break;
	case TOKEN_INSIDE_TYPE_NAME:
		result = "inside type name";
		break;
	case TOKEN_INSIDE_VARIABLE_NAME:
		result = "inside variable name";
		break;
	case PREPROCESSOR_TOKEN_INSIDE:
		result = "inside preprocessor token";
		break;
	case PREPROCESSOR_TOKEN_BETWEEN:
		result = "between preprocessor token";
		break;
	case COMMENT:
		result = "inside comment";
		break;
	case SOURCE_TERMINATION_NULL:
		result = "just before null terminating source";
		break;
	case SOURCE_TERMINATION_NON_NULL:
		result = "as last character in source string, without null termination";
		break;
	case PART_TERMINATION_NULL:
		result = "just before null terminating part of source";
		break;
	case PART_NEXT_TO_TERMINATION_NULL:
		result = "just before last character in part of source";
		break;
	case PART_TERMINATION_NON_NULL:
		result = "as last character in part string, without null termination";
		break;
	case PART_NEXT_TO_TERMINATION_NON_NULL:
		result = "just before last character in part string, without null termination";
		break;
	case DEBUG_CASE: /* intended fall through */
	default:
		result = "nowhere at all. This is debug!";
		break;
	}

	return result;
}